

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
emplace<std::pair<unsigned_int,QMetaObject_const*>const&>
          (QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *this,QObject **key,
          pair<unsigned_int,_const_QMetaObject_*> *args)

{
  long lVar1;
  bool bVar2;
  QObject **in_RCX;
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *in_RDX;
  pair<unsigned_int,_const_QMetaObject_*> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> copy;
  iterator *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::isDetached
                    ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)in_RDI)
  ;
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
            ::shouldGrow(*(Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_>
                           **)in_RSI);
    if (bVar2) {
      emplace_helper<std::pair<unsigned_int,QMetaObject_const*>>(in_RDX,in_RCX,in_RSI);
    }
    else {
      emplace_helper<std::pair<unsigned_int,QMetaObject_const*>const&>(in_RDX,in_RCX,in_RSI);
    }
  }
  else {
    QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::QMultiHash
              ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)this_00,
               (QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)in_RDI);
    QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::detach
              ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)this_00);
    emplace_helper<std::pair<unsigned_int,QMetaObject_const*>const&>(in_RDX,in_RCX,in_RSI);
    QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::~QMultiHash
              ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }